

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O0

int Vec_IntDoubleWidth(Vec_Int_t *p,int nWords)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int local_28;
  int nObjs;
  int w;
  int i;
  int *pArray;
  int nWords_local;
  Vec_Int_t *p_local;
  
  iVar1 = Vec_IntSize(p);
  piVar3 = (int *)calloc((long)(iVar1 << 1),4);
  iVar1 = Vec_IntSize(p);
  iVar2 = Vec_IntSize(p);
  if (iVar2 % nWords != 0) {
    __assert_fail("Vec_IntSize(p) % nWords == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                  ,0xf5,"int Vec_IntDoubleWidth(Vec_Int_t *, int)");
  }
  for (nObjs = 0; nObjs < iVar1 / nWords; nObjs = nObjs + 1) {
    for (local_28 = 0; local_28 < nWords; local_28 = local_28 + 1) {
      piVar3[nWords * 2 * nObjs + local_28] = p->pArray[nWords * nObjs + local_28];
    }
  }
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  p->pArray = piVar3;
  p->nSize = p->nSize << 1;
  p->nCap = p->nSize;
  return nWords << 1;
}

Assistant:

int Vec_IntDoubleWidth( Vec_Int_t * p, int nWords )
{
    int * pArray = ABC_CALLOC( int, Vec_IntSize(p) * 2 );
    int i, w, nObjs = Vec_IntSize(p) / nWords;
    assert( Vec_IntSize(p) % nWords == 0 );
    for ( i = 0; i < nObjs; i++ )
        for ( w = 0; w < nWords; w++ )
            pArray[2 * nWords * i + w] = p->pArray[nWords * i + w];
    ABC_FREE( p->pArray );
    p->pArray = pArray;
    p->nSize *= 2;
    p->nCap = p->nSize;
    return 2 * nWords;
}